

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Stoppable stoppable;
  AReceiver a;
  DemoController demo;
  BaseStoppable local_1a8;
  BaseComponent local_170;
  DemoController local_c0;
  
  DemoController::DemoController(&local_c0);
  BaseThread::Start((BaseThread *)&local_c0,0);
  AReceiver::AReceiver((AReceiver *)&local_170);
  BaseThread::Start((BaseThread *)&local_170,0);
  local_1a8.super_BaseThread._vptr_BaseThread = (_func_int **)0x32;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&local_1a8);
  Stoppable::Stoppable((Stoppable *)&local_1a8);
  BaseThread::operator()(&local_1a8.super_BaseThread,0);
  BaseStoppable::Stop(&local_1a8);
  BaseThread::Wait(&local_1a8.super_BaseThread);
  BaseThread::Wait((BaseThread *)&local_c0);
  BaseStoppable::Stop(&local_170.super_BaseStoppable);
  BaseThread::Wait((BaseThread *)&local_170);
  BaseStoppable::~BaseStoppable(&local_1a8);
  BaseComponent::~BaseComponent(&local_170);
  BaseComponent::~BaseComponent(&local_c0.super_BaseComponent);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    (void)argc, (void)argv;

    DemoController demo;
    demo.Start();

    AReceiver a;
    a.Start();

    std::this_thread::sleep_for(std::chrono::milliseconds(50));

    Stoppable stoppable;
    stoppable();
    stoppable.Stop();

    stoppable.Wait();
    demo.Wait();

    a.Stop();
    a.Wait();
    return 0;
}